

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

event_item * reassign_memory_event(CManager_conflict cm,event_item *event,int do_decode)

{
  int iVar1;
  __pid_t _Var2;
  int iVar3;
  event_item *__dest;
  pthread_t pVar4;
  attr_list p_Var5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int in_EDX;
  int *in_RSI;
  long in_RDI;
  timespec ts;
  void *decode_buffer;
  FFSTypeHandle format;
  FFSContext tmp_context;
  event_item *tmp_event;
  event_item *in_stack_ffffffffffffff88;
  CManager_conflict in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffffa0;
  FILE *__stream;
  char *in_stack_ffffffffffffffa8;
  attr_list in_stack_ffffffffffffffb0;
  CManager in_stack_ffffffffffffffb8;
  undefined8 local_40;
  undefined8 in_stack_ffffffffffffffc8;
  CMTraceType trace_type;
  CManager in_stack_ffffffffffffffd0;
  undefined8 uVar9;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  trace_type = (CMTraceType)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  __dest = get_free_event((event_path_data)in_stack_ffffffffffffff90);
  iVar1 = CMtrace_val[10];
  if (*(long *)(in_RDI + 0x120) == 0) {
    iVar1 = CMtrace_init(in_stack_ffffffffffffffd0,trace_type);
  }
  if (iVar1 != 0) {
    if (CMtrace_PID != 0) {
      __stream = *(FILE **)(in_RDI + 0x120);
      _Var2 = getpid();
      in_stack_ffffffffffffffa8 = (char *)(long)_Var2;
      pVar4 = pthread_self();
      fprintf(__stream,"P%lxT%lx - ",in_stack_ffffffffffffffa8,pVar4);
      iVar3 = (int)((ulong)__stream >> 0x20);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&stack0xffffffffffffffb0);
      fprintf(*(FILE **)(in_RDI + 0x120),"%lld.%.9ld - ",in_stack_ffffffffffffffb0,
              in_stack_ffffffffffffffb8);
    }
    fprintf(*(FILE **)(in_RDI + 0x120),
            "Doing deep copy to free up event before returning from EVsubmit()\n");
  }
  fflush(*(FILE **)(in_RDI + 0x120));
  memcpy(__dest,in_RSI,0x68);
  __dest->ref_count = 1;
  p_Var5 = CMint_add_ref_attr_list
                     (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                      iVar3);
  __dest->attrs = p_Var5;
  in_RSI[0x18] = 0;
  in_RSI[0x19] = 0;
  in_RSI[0x16] = 0;
  in_RSI[0x17] = 0;
  *(long *)(in_RSI + 0x14) = in_RDI;
  encode_event(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  in_RSI[8] = 0;
  in_RSI[9] = 0;
  in_RSI[2] = 1;
  *(undefined8 *)(in_RSI + 0x16) = *(undefined8 *)(in_RSI + 0xe);
  in_RSI[0xe] = 0;
  in_RSI[0xf] = 0;
  *(code **)(in_RSI + 0x18) = free_ioBuffer;
  if (in_EDX != 0) {
    uVar6 = create_FFSContext_FM(*(undefined8 *)(*(long *)(in_RDI + 0x118) + 0x48));
    uVar7 = FFSTypeHandle_from_encode(uVar6,*(undefined8 *)(in_RSI + 4));
    uVar9 = uVar6;
    uVar8 = format_list_of_FMFormat(*(undefined8 *)(in_RSI + 0xc));
    establish_conversion(uVar6,uVar7,uVar8);
    iVar3 = FFSdecode_in_place(uVar9,*(undefined8 *)(in_RSI + 4),&local_40);
    if (iVar3 == 0) {
      printf("Decode failed\n");
      return (event_item *)0x0;
    }
    *(undefined8 *)(in_RSI + 8) = local_40;
    in_RSI[4] = 0;
    in_RSI[5] = 0;
    in_RSI[1] = 0;
    free_FFSContext(uVar9);
  }
  *in_RSI = *in_RSI + -1;
  return __dest;
}

Assistant:

static event_item *
reassign_memory_event(CManager cm, event_item *event, int do_decode)
{
    /* 
     *  The old event item is enqueued on stones elsewhere in EVPath.  We must make the data memory 
     *  it references available application reuse.  So, we are going to:
     *   1 - encode and then decode the event (to get new, clean CM-owned data)
     *   2 - modify the old event structure to reference only the new data
     *   3 - create and return tmp_event, which references only the previous data and 
     *       has a reference count of 1 (so that return_event() does what it needs to do).
     */
    event_item *tmp_event = get_free_event(cm->evp);
    FFSContext tmp_context;
    FFSTypeHandle format;
    void *decode_buffer;

    CMtrace_out(cm, EVerbose, "Doing deep copy to free up event before returning from EVsubmit()\n");
    *tmp_event = *event;
    tmp_event->ref_count = 1;   /* we're going to make sure the enqueued events don't reference anything that this does */
    tmp_event->attrs = CMadd_ref_attr_list(cm, event->attrs);
    event->free_func = NULL;   /* if these were present, no longer applicable */
    event->free_arg = NULL;
    event->cm = cm;
    encode_event(cm, event);  /* Copy all data to an FFS encode buffer in event->ioBuffer */
    event->decoded_event = NULL;      /* we're not touching this anymore */
    event->contents = Event_Freeable; /* it's all our data */
    event->free_arg = event->ioBuffer;
    event->ioBuffer = NULL;
    event->free_func = free_ioBuffer;
    /*
     * The new event type is a bit unique in EVPath.  event->ioBuffer is meant to hold only encoded data, but we 
     * want to decode that stuff, so we don't leave our data there.   Rather, the FFSbuffer created by this will be freed 
     * via the Event_Freeable mechanism.
     */
    if (do_decode) {
	tmp_context = create_FFSContext_FM(cm->evp->fmc);
	format = FFSTypeHandle_from_encode(tmp_context, event->encoded_event);
	establish_conversion(tmp_context, format, format_list_of_FMFormat(event->reference_format));

	if (!FFSdecode_in_place(tmp_context, event->encoded_event, &decode_buffer)) {
	    printf("Decode failed\n");
	    return 0;
	}
	event->decoded_event = decode_buffer;
	event->encoded_event = NULL;
	event->event_encoded = 0;
	free_FFSContext(tmp_context);
    }
    event->ref_count--;   /* we've essentially split the event.  tmp_event will be dereferenced */
    return tmp_event;
}